

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O3

void g_array_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("array");
  garray_class = class_new(ptVar2,(t_newmethod)0x0,garray_free,0x38,2,A_NULL);
  class_setwidget(garray_class,&garray_widgetbehavior);
  p_Var1 = garray_class;
  ptVar2 = gensym("const");
  class_addmethod(p_Var1,garray_const,ptVar2,A_DEFFLOAT,0);
  class_addlist(garray_class,garray_list);
  p_Var1 = garray_class;
  ptVar2 = gensym("bounds");
  class_addmethod(p_Var1,garray_bounds,ptVar2,A_FLOAT,1,1,1,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("xticks");
  class_addmethod(p_Var1,garray_xticks,ptVar2,A_FLOAT,1,1,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("xlabel");
  class_addmethod(p_Var1,garray_xlabel,ptVar2,A_GIMME,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("yticks");
  class_addmethod(p_Var1,garray_yticks,ptVar2,A_FLOAT,1,1,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("ylabel");
  class_addmethod(p_Var1,garray_ylabel,ptVar2,A_GIMME,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("style");
  class_addmethod(p_Var1,garray_style,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("width");
  class_addmethod(p_Var1,garray_width,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,garray_color,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("vis");
  class_addmethod(p_Var1,garray_vis_msg,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("rename");
  class_addmethod(p_Var1,garray_rename,ptVar2,A_SYMBOL,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("read");
  class_addmethod(p_Var1,garray_read,ptVar2,A_SYMBOL,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("write");
  class_addmethod(p_Var1,garray_write,ptVar2,A_SYMBOL,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("resize");
  class_addmethod(p_Var1,garray_resize,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,garray_zoom,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("edit");
  class_addmethod(p_Var1,garray_edit,ptVar2,A_FLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("print");
  class_addmethod(p_Var1,garray_print,ptVar2,A_NULL);
  p_Var1 = garray_class;
  ptVar2 = gensym("sinesum");
  class_addmethod(p_Var1,garray_sinesum,ptVar2,A_GIMME,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("cosinesum");
  class_addmethod(p_Var1,garray_cosinesum,ptVar2,A_GIMME,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("normalize");
  class_addmethod(p_Var1,garray_normalize,ptVar2,A_DEFFLOAT,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("arraydialog");
  class_addmethod(p_Var1,garray_arraydialog,ptVar2,A_SYMBOL,1,1,1,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("arrayviewlistnew");
  class_addmethod(p_Var1,garray_arrayviewlist_new,ptVar2,A_NULL);
  p_Var1 = garray_class;
  ptVar2 = gensym("arrayviewlistfillpage");
  class_addmethod(p_Var1,garray_arrayviewlist_fillpage,ptVar2,A_FLOAT,6,0);
  p_Var1 = garray_class;
  ptVar2 = gensym("arrayviewclose");
  class_addmethod(p_Var1,garray_arrayviewlist_close,ptVar2,A_NULL);
  class_setsavefn(garray_class,garray_save);
  return;
}

Assistant:

void g_array_setup(void)
{
    garray_class = class_new(gensym("array"), 0, (t_method)garray_free,
        sizeof(t_garray), CLASS_GOBJ, 0);
    class_setwidget(garray_class, &garray_widgetbehavior);
    class_addmethod(garray_class, (t_method)garray_const, gensym("const"),
        A_DEFFLOAT, A_NULL);
    class_addlist(garray_class, garray_list);
    class_addmethod(garray_class, (t_method)garray_bounds, gensym("bounds"),
        A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);
    class_addmethod(garray_class, (t_method)garray_xticks, gensym("xticks"),
        A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_xlabel, gensym("xlabel"),
        A_GIMME, 0);
    class_addmethod(garray_class, (t_method)garray_yticks, gensym("yticks"),
        A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_ylabel, gensym("ylabel"),
        A_GIMME, 0);
    class_addmethod(garray_class, (t_method)garray_style, gensym("style"),
        A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_width, gensym("width"),
        A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_color, gensym("color"),
        A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_vis_msg, gensym("vis"),
        A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_rename, gensym("rename"),
        A_SYMBOL, 0);
    class_addmethod(garray_class, (t_method)garray_read, gensym("read"),
        A_SYMBOL, A_NULL);
    class_addmethod(garray_class, (t_method)garray_write, gensym("write"),
        A_SYMBOL, A_NULL);
    class_addmethod(garray_class, (t_method)garray_resize, gensym("resize"),
        A_FLOAT, A_NULL);
    class_addmethod(garray_class, (t_method)garray_zoom, gensym("zoom"),
        A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_edit, gensym("edit"),
        A_FLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_print, gensym("print"),
        A_NULL);
    class_addmethod(garray_class, (t_method)garray_sinesum, gensym("sinesum"),
        A_GIMME, 0);
    class_addmethod(garray_class, (t_method)garray_cosinesum,
        gensym("cosinesum"), A_GIMME, 0);
    class_addmethod(garray_class, (t_method)garray_normalize,
        gensym("normalize"), A_DEFFLOAT, 0);
    class_addmethod(garray_class, (t_method)garray_arraydialog,
        gensym("arraydialog"), A_SYMBOL, A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);
/* jsarlo { */
    class_addmethod(garray_class, (t_method)garray_arrayviewlist_new,
        gensym("arrayviewlistnew"), A_NULL);
    class_addmethod(garray_class, (t_method)garray_arrayviewlist_fillpage,
        gensym("arrayviewlistfillpage"), A_FLOAT, A_DEFFLOAT, A_NULL);
    class_addmethod(garray_class, (t_method)garray_arrayviewlist_close,
      gensym("arrayviewclose"), A_NULL);
/* } jsarlo */
    class_setsavefn(garray_class, garray_save);
}